

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O2

string * wasm::Path::getDirName(string *__return_storage_ptr__,string *path)

{
  string *psVar1;
  long lVar2;
  long lVar3;
  long local_58;
  long local_50;
  string *local_38;
  
  local_38 = __return_storage_ptr__;
  getAllPathSeparators_abi_cxx11_();
  lVar3 = 0;
  do {
    if (local_50 == lVar3) {
      std::__cxx11::string::~string((string *)&local_58);
      psVar1 = local_38;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_38,"",(allocator<char> *)&local_58);
      return psVar1;
    }
    lVar2 = std::__cxx11::string::rfind((char)path,(ulong)(uint)(int)*(char *)(local_58 + lVar3));
    psVar1 = local_38;
    lVar3 = lVar3 + 1;
  } while (lVar2 == -1);
  std::__cxx11::string::substr((ulong)local_38,(ulong)path);
  std::__cxx11::string::~string((string *)&local_58);
  return psVar1;
}

Assistant:

std::string getDirName(const std::string& path) {
  for (char c : getAllPathSeparators()) {
    auto sep = path.rfind(c);
    if (sep != std::string::npos) {
      return path.substr(0, sep);
    }
  }
  return "";
}